

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLexicalAnalyzer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  ifstream fin;
  undefined1 local_238 [520];
  
  if (argc == 1) {
    iVar1 = analyze();
    return iVar1;
  }
  if (1 < argc) {
    uVar2 = 1;
    do {
      std::ifstream::ifstream(local_238,argv[uVar2],_S_in);
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      iVar1 = analyze();
      if (0 < iVar1) {
        std::ifstream::~ifstream(local_238);
        return iVar1;
      }
      std::ifstream::close();
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      std::ifstream::~ifstream(local_238);
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        return analyze();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            int code = analyze();
            if (code > 0)
                return code;
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}